

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Gia_Man_t * Jf_ManDeriveMappingGia(Jf_Man_t *p)

{
  uint *pCut;
  Jf_Par_t *pJVar1;
  Vec_Int_t *vLits_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p_05;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  Cnf_Dat_t *pCVar8;
  uint uVar9;
  int Fill;
  int Fill_00;
  int iVar10;
  long lVar11;
  word *local_68;
  Vec_Int_t *vClas;
  Vec_Int_t *vLits;
  word uTruth;
  
  p_00 = Vec_IntStartFull(p->pGia->nObjs);
  p_01 = Vec_IntStart((p->pGia->nObjs + (int)p->pPars->Area) * 2 + (int)p->pPars->Edge);
  p_02 = Vec_IntStart((int)p->pPars->Edge + (int)p->pPars->Area * 2 + 1000);
  p_03 = Vec_IntAlloc(0x10000);
  p_04 = Vec_IntAlloc(0x10);
  vLits = (Vec_Int_t *)0x0;
  vClas = (Vec_Int_t *)0x0;
  uTruth = 0;
  if (p->pPars->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5a3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  if (p->pPars->fGenCnf != 0) {
    pVVar4 = Vec_IntAlloc(1000);
    vLits = pVVar4;
    vClas = Vec_IntAlloc(1000);
    Vec_IntPush(vClas,pVVar4->nSize);
    Vec_IntPush(pVVar4,1);
  }
  p_05 = Gia_ManStart(p->pGia->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pGia->pName);
  p_05->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pGia->pSpec);
  p_05->pSpec = pcVar5;
  Vec_IntWriteEntry(p_00,0,0);
  for (iVar10 = 0; iVar10 < p->pGia->vCis->nSize; iVar10 = iVar10 + 1) {
    pGVar6 = Gia_ManCi(p->pGia,iVar10);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p->pGia,pGVar6);
    iVar3 = Gia_ManAppendCi(p_05);
    Vec_IntWriteEntry(p_00,iVar2,iVar3);
  }
  local_68 = &uTruth;
  for (iVar10 = 0; iVar10 < p->pGia->nObjs; iVar10 = iVar10 + 1) {
    pGVar6 = Gia_ManObj(p->pGia,iVar10);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar2 = Gia_ObjIsBuf(pGVar6);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjRefNum(p->pGia,pGVar6);
        if (iVar2 != 0) {
          piVar7 = Jf_ObjCuts(p,iVar10);
          pCut = (uint *)(piVar7 + 1);
          iVar2 = Jf_CutFuncClass((int *)pCut);
          uVar9 = piVar7[1] & 0xf;
          if (uVar9 == 1) {
            if (iVar2 != 1) {
              __assert_fail("Class == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x5c3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
            }
            iVar2 = piVar7[2];
            iVar3 = Jf_CutFuncCompl((int *)pCut);
            iVar2 = Abc_LitNotCond(iVar2,iVar3);
            iVar2 = Abc_Lit2LitL(p_00->pArray,iVar2);
            Vec_IntWriteEntry(p_00,iVar10,iVar2);
          }
          else if (uVar9 == 0) {
            if (iVar2 != 0) {
              __assert_fail("Class == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x5bd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
            }
            Vec_IntWriteEntry(p_00,iVar10,(uint)piVar7[1] >> 8);
          }
          else {
            if (p->pPars->fFuncDsd == 0) {
              local_68 = Vec_MemReadEntry(p->vTtMem,iVar2);
            }
            else {
              uTruth = Sdm_ManReadDsdTruth(p->pDsd,iVar2);
            }
            if (p->pDsd != (Sdm_Man_t *)0x0) {
              uVar9 = Sdm_ManReadDsdVarNum(p->pDsd,iVar2);
              if (uVar9 != (*pCut & 0xf)) {
                __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                              ,0x5cd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
              }
            }
            p_04->nSize = 0;
            for (uVar9 = 1; uVar9 <= (*pCut & 0xf); uVar9 = uVar9 + 1) {
              iVar2 = Jf_CutLit((int *)pCut,uVar9);
              if (iVar2 == 0) break;
              iVar2 = Abc_Lit2LitL(p_00->pArray,iVar2);
              Vec_IntPush(p_04,iVar2);
            }
            iVar2 = Kit_TruthToGia(p_05,(uint *)local_68,p_04->nSize,p_03,p_04,0);
            if (p->pPars->fGenCnf != 0) {
              Jf_ManGenCnf(uTruth,iVar2,p_04,vLits,vClas,p_03);
            }
            iVar3 = Jf_CutFuncCompl((int *)pCut);
            iVar2 = Abc_LitNotCond(iVar2,iVar3);
            Vec_IntWriteEntry(p_00,iVar10,iVar2);
            iVar3 = Abc_Lit2Var(iVar2);
            iVar2 = p_02->nSize;
            Vec_IntFillExtra(p_01,iVar3 + 1,Fill);
            Vec_IntWriteEntry(p_01,iVar3,iVar2);
            Vec_IntPush(p_02,p_04->nSize);
            for (iVar2 = 0; iVar2 < p_04->nSize; iVar2 = iVar2 + 1) {
              iVar3 = Vec_IntEntry(p_04,iVar2);
              iVar3 = Abc_Lit2Var(iVar3);
              Vec_IntPush(p_02,iVar3);
            }
            iVar2 = Vec_IntEntry(p_00,iVar10);
            iVar2 = Abc_Lit2Var(iVar2);
            Vec_IntPush(p_02,iVar2);
          }
        }
      }
    }
  }
  vLits_00 = vLits;
  pVVar4 = vClas;
  for (iVar10 = 0; iVar10 < p->pGia->vCos->nSize; iVar10 = iVar10 + 1) {
    pGVar6 = Gia_ManCo(p->pGia,iVar10);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if (p->pPars->fGenCnf != 0) {
      p_04->nSize = 0;
    }
    iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar6);
    iVar2 = Vec_IntEntry(p_00,iVar2);
    if (p->pPars->fGenCnf != 0) {
      iVar3 = Abc_LitNotCond(iVar2,*(uint *)pGVar6 >> 0x1d & 1);
      Vec_IntPush(p_04,iVar3);
    }
    iVar2 = Abc_LitNotCond(iVar2,*(uint *)pGVar6 >> 0x1d & 1);
    iVar2 = Gia_ManAppendCo(p_05,iVar2);
    if (p->pPars->fGenCnf != 0) {
      Jf_ManGenCnf(0xaaaaaaaaaaaaaaaa,iVar2,p_04,vLits_00,pVVar4,p_03);
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_03);
  Vec_IntFree(p_04);
  iVar10 = p_05->nObjs;
  if (iVar10 < p_01->nSize) {
    p_01->nSize = iVar10;
  }
  else {
    Vec_IntFillExtra(p_01,iVar10,Fill_00);
    iVar10 = p_05->nObjs;
    if (p_01->nSize != iVar10) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x5f2,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
    }
  }
  for (lVar11 = 0; lVar11 < iVar10; lVar11 = lVar11 + 1) {
    iVar2 = Vec_IntEntry(p_01,(int)lVar11);
    if (0 < iVar2) {
      p_01->pArray[lVar11] = p_01->pArray[lVar11] + p_05->nObjs;
    }
  }
  iVar10 = p_02->nSize;
  iVar2 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
    iVar2 = 0;
  }
  for (; iVar10 != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(p_02,iVar2);
    Vec_IntPush(p_01,iVar3);
  }
  Vec_IntFree(p_02);
  if (p_05->vMapping == (Vec_Int_t *)0x0) {
    p_05->vMapping = p_01;
    Gia_ManSetRegNum(p_05,p->pGia->nRegs);
    pJVar1 = p->pPars;
    if (pJVar1->fGenCnf != 0) {
      if (pJVar1->fCnfObjIds == 0) {
        pCVar8 = Jf_ManCreateCnfRemap(p_05,vLits_00,pVVar4,pJVar1->fAddOrCla);
      }
      else {
        pCVar8 = Jf_ManCreateCnf(p_05,vLits_00,pVVar4);
      }
      p_05->pData = pCVar8;
    }
    Vec_IntFreeP(&vLits);
    Vec_IntFreeP(&vClas);
    return p_05;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                ,0x5f9,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
}

Assistant:

Gia_Man_t * Jf_ManDeriveMappingGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Vec_Int_t * vLits = NULL, * vClas = NULL;
    int i, k, iLit, Class, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    if ( p->pPars->fGenCnf )
    {
        vLits = Vec_IntAlloc( 1000 );
        vClas = Vec_IntAlloc( 1000 );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, 1 );
    }
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        Class = Jf_CutFuncClass( pCut );
        if ( Jf_CutSize(pCut) == 0 )
        {
            assert( Class == 0 );
            Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
            continue;
        }
        if ( Jf_CutSize(pCut) == 1 )
        {
            assert( Class == 1 );
            iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
            iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( p->pPars->fFuncDsd )
            uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
        else
            pTruth = Vec_MemReadEntry(p->vTtMem, Class);
        assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        // collect leaves
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( uTruth, iLit, vLeaves, vLits, vClas, vCover );
        iLit = Abc_LitNotCond( iLit, Jf_CutFuncCompl(pCut) );
        Vec_IntWriteEntry( vCopies, i, iLit );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        if ( p->pPars->fGenCnf )
            Vec_IntClear( vLeaves );
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        if ( p->pPars->fGenCnf )
            Vec_IntPush( vLeaves, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( ABC_CONST(0xAAAAAAAAAAAAAAAA), iLit, vLeaves, vLits, vClas, vCover );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    // derive CNF
    if ( p->pPars->fGenCnf )
    {
        if ( p->pPars->fCnfObjIds )
            pNew->pData = Jf_ManCreateCnf( pNew, vLits, vClas );
        else
            pNew->pData = Jf_ManCreateCnfRemap( pNew, vLits, vClas, p->pPars->fAddOrCla );
    }
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vClas );
    return pNew;
}